

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void nh_ws_on_close_handler(ws_context_t *ctx,ws_session_t *session)

{
  char local_a;
  char local_9;
  
  session->flags = session->flags | 2;
  local_a = '\x03';
  if (ctx == (ws_context_t *)0x0) {
    local_9 = -0x18;
  }
  else {
    local_9 = ((ctx->frame).payload_length == 0) * '\x05' + -0x18;
  }
  nh_ws_emit(session,2,&local_a,'\b');
  return;
}

Assistant:

void nh_ws_on_close_handler(ws_context_t *ctx, ws_session_t *session) {
    FLAG_SET(session->flags, WEBSOCKET_SESSION_CLOSE);
    unsigned char status[2];
    status[0] = 0x03;
    if (ctx == NULL || ctx->frame.payload_length > 0) {
        status[1] = 0xe8;
        nh_ws_emit(session, 2, (char *) status, WEBSOCKET_OP_CLOSE);
    } else {
        status[1] = 0xed;
        nh_ws_emit(session, 2, (char *) status, WEBSOCKET_OP_CLOSE);
    }
}